

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

bool P_Thing_Projectile(int tid,AActor *source,int type,char *type_name,DAngle *angle,double speed,
                       double vspeed,int dest,AActor *forcedest,int gravity,int newtid,
                       bool leadTarget)

{
  bool bVar1;
  PClass *pPVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  PClassActor *pPVar6;
  AActor *this;
  AActor **ppAVar7;
  ulong uVar8;
  AActor **ppAVar9;
  AActor *pAVar10;
  double dVar11;
  double dVar12;
  ulong extraout_XMM0_Qb;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  DVector3 local_118;
  AActor *local_100;
  uint local_f4;
  double local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  PClass *pPStack_d0;
  ulong local_c0;
  double local_b8;
  ulong uStack_b0;
  AActor **local_a8;
  PClassActor *local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  DAngle *local_80;
  AActor *local_78;
  AActor **local_70;
  double local_68;
  AActor *local_60;
  double local_58;
  _func_int **local_50;
  PClass *local_48;
  PClass *pPStack_40;
  
  local_f0 = speed;
  local_58 = vspeed;
  if (type_name == (char *)0x0) {
    pPVar6 = P_GetSpawnableType(type);
  }
  else {
    pPVar6 = PClass::FindActor(type_name);
  }
  if (pPVar6 != (PClassActor *)0x0) {
    pPVar6 = PClassActor::GetReplacement(pPVar6,true);
    uVar4 = *(uint *)((pPVar6->super_PClass).Defaults + 0x1c4);
    if (((uVar4 >> 0xd & 1) == 0) ||
       (((dmflags.Value._1_1_ & 0x10) == 0 && ((level.flags2._1_1_ & 0x80) == 0)))) {
      if (tid == 0) {
        local_60 = (AActor *)0x0;
        if (source != (AActor *)0x0) {
LAB_0045ab27:
          bVar1 = local_f0 <= 0.0;
          ppAVar9 = AActor::TIDHash + (dest & 0x7f);
          local_70 = AActor::TIDHash + (tid & 0x7f);
          local_68 = *(double *)(&DAT_00607e10 + (ulong)((uVar4 & 1) == 0) * 8);
          uVar8 = 0;
          local_f4 = uVar4;
          local_a8 = ppAVar9;
          local_a0 = pPVar6;
          do {
            if (dest == 0) {
              pAVar10 = (AActor *)0x0;
              local_78 = forcedest;
LAB_0045abe1:
              do {
                local_118.Z = local_68;
                if ((uVar4 & 3) == 0) {
                  dVar11 = (source->__Pos).Z;
                  local_118.Z = -2147483648.0;
                  if ((dVar11 != -2147483648.0) || (NAN(dVar11))) {
                    local_118.Z = dVar11 - source->Floorclip;
                  }
                }
                local_118.X = (source->__Pos).X;
                local_118.Y = (source->__Pos).Y;
                local_100 = forcedest;
                local_c0 = uVar8;
                this = AActor::StaticSpawn(pPVar6,&local_118,ALLOW_REPLACE,false);
                if (this == (AActor *)0x0) {
LAB_0045aecb:
                  uVar8 = local_c0 & 0xffffffff;
                }
                else {
                  this->tid = newtid;
                  AActor::AddToHash(this);
                  P_PlaySpawnSound(this,source);
                  uVar4 = (this->flags).Value;
                  if (gravity == 0) {
                    (this->flags).Value = uVar4 | 0x200;
                  }
                  else {
                    (this->flags).Value = uVar4 & 0xfffffdff;
                    if ((gravity == 1) && (((this->flags3).Value & 0x2000) == 0)) {
                      this->Gravity = 0.125;
                    }
                  }
                  (this->target).field_0.p = source;
                  if (local_100 == (AActor *)0x0) {
                    (this->Angles).Yaw.Degrees = angle->Degrees;
                    AActor::VelFromAngle(this,local_f0);
                    (this->Vel).Z = local_58;
                  }
                  else {
                    AActor::Vec3To(&local_118,this,local_100);
                    local_118.Z = local_100->Height * 0.5 + local_118.Z;
                    if (bVar1 || !leadTarget) {
LAB_0045ad60:
                      AActor::AngleTo((AActor *)&stack0xffffffffffffffb0,this,SUB81(local_100,0));
                      (this->Angles).Yaw.Degrees = (double)local_50;
                      dVar11 = c_sqrt(local_118.Z * local_118.Z +
                                      local_118.X * local_118.X + local_118.Y * local_118.Y);
                      if ((dVar11 != 0.0) ||
                         (dVar12 = local_118.Z, dVar13 = local_118.X, dVar14 = local_118.Y,
                         NAN(dVar11))) {
                        dVar11 = local_f0 / dVar11;
                        dVar12 = dVar11 * local_118.Z;
                        dVar13 = dVar11 * local_118.X;
                        dVar14 = dVar11 * local_118.Y;
                      }
                      (this->Vel).Z = dVar12;
                      (this->Vel).X = dVar13;
                      (this->Vel).Y = dVar14;
                    }
                    else {
                      dVar12 = (local_100->Vel).X;
                      pPVar2 = (PClass *)(local_100->Vel).Y;
                      dVar11 = (local_100->Vel).Z;
                      if (((((dVar12 == 0.0) && (!NAN(dVar12))) && ((double)pPVar2 == 0.0)) &&
                          ((!NAN((double)pPVar2) && (dVar11 == 0.0)))) && (!NAN(dVar11)))
                      goto LAB_0045ad60;
                      dVar13 = dVar11;
                      if (((local_100->flags).Value & 0x200) == 0) {
                        dVar13 = 0.0;
                        if (2 < local_100->waterlevel) {
                          dVar13 = dVar11;
                        }
                        if (((dVar12 == 0.0) && (!NAN(dVar12))) &&
                           ((local_100->waterlevel < 3 &&
                            (((double)pPVar2 == 0.0 && (!NAN((double)pPVar2)))))))
                        goto LAB_0045ad60;
                      }
                      dStack_e0 = 0.0;
                      local_e8 = dVar13;
                      local_d8 = dVar12;
                      pPStack_d0 = pPVar2;
                      local_48 = pPVar2;
                      pPStack_40 = pPVar2;
                      local_98 = c_sqrt(local_118.Z * local_118.Z +
                                        local_118.Y * local_118.Y + local_118.X * local_118.X);
                      local_b8 = c_sqrt(local_e8 * local_e8 +
                                        (double)pPStack_d0 * (double)pPStack_d0 +
                                        local_d8 * local_d8);
                      dVar12 = (((-local_118.Y * (double)local_48 - local_118.X * local_d8) -
                                local_118.Z * local_e8) / local_b8) / local_98;
                      dVar11 = 1.0;
                      if (dVar12 <= 1.0) {
                        dVar11 = dVar12;
                      }
                      local_88 = c_acos((double)(~-(ulong)(-1.0 < dVar12) & 0xbff0000000000000 |
                                                (ulong)dVar11 & -(ulong)(-1.0 < dVar12)));
                      uVar4 = FRandom::GenRand32(&pr_leadtarget);
                      local_80 = angle;
                      uVar5 = FRandom::GenRand32(&pr_leadtarget);
                      angle = local_80;
                      local_b8 = (((double)(int)((uVar4 & 0xff) - (uVar5 & 0xff)) * 0.1) / 255.0 +
                                 1.1) * local_b8;
                      dVar11 = FFastTrig::sin(&fasttrig,6755399441055744.0);
                      dVar11 = (dVar11 * local_b8) / local_f0;
                      uStack_b0 = (extraout_XMM0_Qb ^ 0x8000000000000000) & extraout_XMM0_Qb;
                      local_b8 = (double)(~-(ulong)(-1.0 < dVar11) & 0x3ff0000000000000 |
                                         (-(ulong)(1.0 <= dVar11) & 0xbff0000000000000 |
                                         ~-(ulong)(1.0 <= dVar11) & (ulong)-dVar11) &
                                         -(ulong)(-1.0 < dVar11));
                      local_98 = local_f0 / local_98;
                      uStack_90 = 0;
                      dStack_e0 = local_118.X * local_e8;
                      local_e8 = local_118.Z * (double)pPStack_d0 - local_e8 * local_118.Y;
                      dStack_e0 = dStack_e0 - local_d8 * local_118.Z;
                      local_d8 = local_d8 * local_118.Y - (double)local_48 * local_118.X;
                      dVar11 = c_sqrt(local_d8 * local_d8 +
                                      dStack_e0 * dStack_e0 + local_e8 * local_e8);
                      dVar11 = (double)(~-(ulong)(dVar11 != 0.0) & (ulong)dVar11 |
                                       (ulong)(1.0 / dVar11) & -(ulong)(dVar11 != 0.0));
                      local_e8 = dVar11 * local_e8;
                      dStack_e0 = dVar11 * dStack_e0;
                      local_d8 = dVar11 * local_d8;
                      pPStack_d0 = (PClass *)0x0;
                      dVar11 = c_asin(local_b8);
                      dVar11 = FFastTrig::cos(&fasttrig,
                                              dVar11 * 683565275.5764316 + 6755399441055744.0);
                      dVar14 = 1.0 - dVar11;
                      dVar15 = dVar14 * local_e8;
                      dVar17 = dStack_e0 * dVar14 * dStack_e0;
                      dVar16 = local_d8 * dVar14 * dStack_e0;
                      dVar12 = local_98 *
                               (local_118.Z * (local_d8 * dVar15 + dStack_e0 * local_b8) +
                               (dVar11 + local_e8 * dVar15) * local_118.X +
                               local_118.Y * (dStack_e0 * dVar15 - local_b8 * local_d8));
                      dVar13 = local_98 *
                               (local_118.Z * (dVar16 - local_e8 * local_b8) +
                               (dVar11 + dVar17) * local_118.Y +
                               local_118.X * (dStack_e0 * dVar15 + local_b8 * local_d8));
                      (this->Vel).Z =
                           ((((dVar14 - local_e8 * dVar15) - dVar17) + dVar11) * local_118.Z +
                           (dVar16 + local_e8 * local_b8) * local_118.Y +
                           (local_d8 * dVar15 - dStack_e0 * local_b8) * local_118.X) * local_98;
                      (this->Vel).X = dVar12;
                      (this->Vel).Y = dVar13;
                      dVar11 = c_atan2(dVar13,dVar12);
                      (this->Angles).Yaw.Degrees = dVar11 * 57.29577951308232;
                    }
                    if (((this->flags2).Value & 0x40000000) != 0) {
                      (this->tracer).field_0.p = local_100;
                    }
                  }
                  if (((this->flags).Value & 0x10000) != 0) {
                    dVar11 = (this->Vel).X;
                    dVar12 = (this->Vel).Y;
                    dVar13 = (this->Vel).Z;
                    dVar11 = c_sqrt(dVar13 * dVar13 + dVar11 * dVar11 + dVar12 * dVar12);
                    this->Speed = dVar11;
                  }
                  if (((this->flags3).Value & 3) != 0) {
                    (this->Vel).Z = 0.0;
                  }
                  uVar4 = (this->flags).Value;
                  if ((uVar4 & 1) != 0) {
                    uVar4 = uVar4 | 0x20000;
                    (this->flags).Value = uVar4;
                  }
                  if ((uVar4 >> 0x10 & 1) == 0) {
                    bVar3 = P_TestMobjLocation(this);
                    uVar8 = 1;
                    if (!bVar3) {
                      AActor::ClearCounters(this);
                      (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
                      goto LAB_0045aecb;
                    }
                  }
                  else {
                    bVar3 = P_CheckMissileSpawn(this,source->radius);
                    uVar8 = local_c0 & 0xffffffff;
                    if (bVar3) {
                      uVar8 = 1;
                    }
                  }
                }
                pPVar6 = local_a0;
                ppAVar9 = local_a8;
                uVar4 = local_f4;
                if (dest == 0) goto LAB_0045b3ba;
                ppAVar7 = &pAVar10->inext;
                if (pAVar10 == (AActor *)0x0) {
                  ppAVar7 = local_a8;
                }
                forcedest = *ppAVar7;
                while( true ) {
                  if (forcedest == (AActor *)0x0) {
                    local_78 = (AActor *)0x0;
                    goto LAB_0045b3ba;
                  }
                  pAVar10 = forcedest;
                  if (forcedest->tid == dest) break;
                  forcedest = forcedest->inext;
                }
              } while( true );
            }
            for (forcedest = *ppAVar9; forcedest != (AActor *)0x0; forcedest = forcedest->inext) {
              pAVar10 = forcedest;
              local_78 = forcedest;
              if (forcedest->tid == dest) goto LAB_0045abe1;
            }
            local_78 = (AActor *)0x0;
LAB_0045b3ba:
            if (tid == 0) goto LAB_0045b41d;
            ppAVar7 = &local_60->inext;
            if (local_60 == (AActor *)0x0) {
              ppAVar7 = local_70;
            }
            local_60 = *ppAVar7;
            while( true ) {
              if (local_60 == (AActor *)0x0) goto LAB_0045b41d;
              forcedest = local_78;
              source = local_60;
              if (local_60->tid == tid) break;
              local_60 = local_60->inext;
            }
          } while( true );
        }
        goto LAB_0045ab05;
      }
      for (local_60 = AActor::TIDHash[tid & 0x7f]; local_60 != (AActor *)0x0;
          local_60 = local_60->inext) {
        source = local_60;
        if (local_60->tid == tid) goto LAB_0045ab27;
      }
    }
  }
  local_60 = (AActor *)0x0;
LAB_0045ab05:
  return SUB81(local_60,0);
LAB_0045b41d:
  local_60 = (AActor *)(ulong)((int)uVar8 != 0);
  goto LAB_0045ab05;
}

Assistant:

bool P_Thing_Projectile (int tid, AActor *source, int type, const char *type_name, DAngle angle,
	double speed, double vspeed, int dest, AActor *forcedest, int gravity, int newtid,
	bool leadTarget)
{
	int rtn = 0;
	PClassActor *kind;
	AActor *spot, *mobj, *targ = forcedest;
	FActorIterator iterator (tid);
	int defflags3;

	if (type_name == NULL)
	{
		kind = P_GetSpawnableType(type);
	}
	else
	{
		kind = PClass::FindActor(type_name);
	}
	if (kind == NULL)
	{
		return false;
	}

	// Handle decorate replacements.
	kind = kind->GetReplacement();

	defflags3 = GetDefaultByType(kind)->flags3;
	if ((defflags3 & MF3_ISMONSTER) && 
		((dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS)))
		return false;

	if (tid == 0)
	{
		spot = source;
	}
	else
	{
		spot = iterator.Next();
	}
	while (spot != NULL)
	{
		FActorIterator tit (dest);

		if (dest == 0 || (targ = tit.Next()))
		{
			do
			{
				double z = spot->Z();
				if (defflags3 & MF3_FLOORHUGGER)
				{
					z = ONFLOORZ;
				}
				else if (defflags3 & MF3_CEILINGHUGGER)
				{
					z = ONCEILINGZ;
				}
				else if (z != ONFLOORZ)
				{
					z -= spot->Floorclip;
				}
				mobj = Spawn (kind, spot->PosAtZ(z), ALLOW_REPLACE);

				if (mobj)
				{
					mobj->tid = newtid;
					mobj->AddToHash ();
					P_PlaySpawnSound(mobj, spot);
					if (gravity)
					{
						mobj->flags &= ~MF_NOGRAVITY;
						if (!(mobj->flags3 & MF3_ISMONSTER) && gravity == 1)
						{
							mobj->Gravity = 1./8;
						}
					}
					else
					{
						mobj->flags |= MF_NOGRAVITY;
					}
					mobj->target = spot;

					if (targ != NULL)
					{
						DVector3 aim = mobj->Vec3To(targ);
						aim.Z += targ->Height / 2;

						if (leadTarget && speed > 0 && !targ->Vel.isZero())
						{
							// Aiming at the target's position some time in the future
							// is basically just an application of the law of sines:
							//     a/sin(A) = b/sin(B)
							// Thanks to all those on the notgod phorum for helping me
							// with the math. I don't think I would have thought of using
							// trig alone had I been left to solve it by myself.

							DVector3 tvel = targ->Vel;
							if (!(targ->flags & MF_NOGRAVITY) && targ->waterlevel < 3)
							{ // If the target is subject to gravity and not underwater,
							  // assume that it isn't moving vertically. Thanks to gravity,
							  // even if we did consider the vertical component of the target's
							  // velocity, we would still miss more often than not.
								tvel.Z = 0.0;
								if (targ->Vel.X == 0 && targ->Vel.Y == 0)
								{
									goto nolead;
								}
							}
							double dist = aim.Length();
							double targspeed = tvel.Length();
							double ydotx = -aim | tvel;
							double a = g_acos (clamp (ydotx / targspeed / dist, -1.0, 1.0));
							double multiplier = double(pr_leadtarget.Random2())*0.1/255+1.1;
							double sinb = -clamp (targspeed*multiplier * g_sin(a) / speed, -1.0, 1.0);

							// Use the cross product of two of the triangle's sides to get a
							// rotation vector.
							DVector3 rv(tvel ^ aim);
							// The vector must be normalized.
							rv.MakeUnit();
							// Now combine the rotation vector with angle b to get a rotation matrix.
							DMatrix3x3 rm(rv, g_cos(g_asin(sinb)), sinb);
							// And multiply the original aim vector with the matrix to get a
							// new aim vector that leads the target.
							DVector3 aimvec = rm * aim;
							// And make the projectile follow that vector at the desired speed.
							mobj->Vel = aimvec * (speed / dist);
							mobj->AngleFromVel();
						}
						else
						{
nolead:
							mobj->Angles.Yaw = mobj->AngleTo(targ);
							mobj->Vel = aim.Resized (speed);
						}
						if (mobj->flags2 & MF2_SEEKERMISSILE)
						{
							mobj->tracer = targ;
						}
					}
					else
					{
						mobj->Angles.Yaw = angle;
						mobj->VelFromAngle(speed);
						mobj->Vel.Z = vspeed;
					}
					// Set the missile's speed to reflect the speed it was spawned at.
					if (mobj->flags & MF_MISSILE)
					{
						mobj->Speed = mobj->VelToSpeed();
					}
					// Hugger missiles don't have any vertical velocity
					if (mobj->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER))
					{
						mobj->Vel.Z = 0;
					}
					if (mobj->flags & MF_SPECIAL)
					{
						mobj->flags |= MF_DROPPED;
					}
					if (mobj->flags & MF_MISSILE)
					{
						if (P_CheckMissileSpawn (mobj, spot->radius))
						{
							rtn = true;
						}
					}
					else if (!P_TestMobjLocation (mobj))
					{
						// If this is a monster, subtract it from the total monster
						// count, because it already added to it during spawning.
						mobj->ClearCounters();
						mobj->Destroy ();
					}
					else
					{
						// It spawned fine.
						rtn = 1;
					}
				}
			} while (dest != 0 && (targ = tit.Next()));
		}
		spot = iterator.Next();
	}

	return rtn != 0;
}